

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::unique_copy(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  bool bVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_c1;
  vector<int,_std::allocator<int>_> local_c0;
  iterator_type local_a8;
  view_pointer local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> local_88;
  type local_68 [4];
  type local_58 [6];
  circular_view<int,_18446744073709551615UL> local_40;
  
  local_40.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_40.member.cap = 4;
  local_40.member.size = 0;
  local_40.member.next = 4;
  local_88.member.data = (pointer)0x160000000b;
  local_88.member.cap = 0x2c00000021;
  local_88.member.size = 0x3700000037;
  input._M_len = 6;
  input._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_40,input);
  local_88.member.data = local_68;
  local_88.member.cap = 4;
  local_88.member.size = 0;
  local_88.member.next = 4;
  local_a8.current = local_40.member.cap * 2;
  if ((local_a8.current & local_40.member.cap * 2 - 1) == 0) {
    local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(local_40.member.next - local_40.member.size & local_a8.current - 1);
    local_a8.current = local_a8.current - 1 & local_40.member.next;
  }
  else {
    local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_40.member.next - local_40.member.size) % local_a8.current);
    local_a8.current = local_40.member.next % local_a8.current;
  }
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_40;
  local_a8.parent = &local_40;
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    ((basic_iterator<int> *)&local_c0,&local_a8);
  if (!bVar2) {
    std::
    __unique_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_a8.parent,local_a8.current,&local_88);
  }
  local_a8.parent = (view_pointer)0x2c00000021;
  local_a8.current = CONCAT44(local_a8.current._4_4_,0x37);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l,&local_c1);
  uVar1 = local_88.member.cap * 2;
  if ((uVar1 & local_88.member.cap * 2 - 1) == 0) {
    uVar3 = local_88.member.next - local_88.member.size & uVar1 - 1;
    sStack_90 = uVar1 - 1 & local_88.member.next;
  }
  else {
    uVar3 = (local_88.member.next - local_88.member.size) % uVar1;
    sStack_90 = local_88.member.next % uVar1;
  }
  first_end.current = sStack_90;
  first_end.parent = &local_88;
  first_begin.current = uVar3;
  first_begin.parent = &local_88;
  local_98 = &local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xc9,"void copy_suite::unique_copy()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void unique_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::unique_copy(span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}